

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateOffsets
          (MessageGenerator *this,Printer *printer)

{
  int in_EDX;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_00;
  long lVar1;
  protobuf *this_00;
  int i;
  long lVar2;
  string local_50;
  
  this_00 = (protobuf *)0x1;
  if (1 < (int)*(uint *)(this->descriptor_ + 0x2c)) {
    this_00 = (protobuf *)(ulong)*(uint *)(this->descriptor_ + 0x2c);
  }
  SimpleItoa_abi_cxx11_(&local_50,this_00,in_EDX);
  io::Printer::Print(printer,"static const int $classname$_offsets_[$field_count$] = {\n",
                     "classname",&this->classname_,"field_count",&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  io::Printer::Indent(printer);
  lVar1 = 0;
  field = extraout_RDX;
  for (lVar2 = 0; lVar2 < *(int *)(this->descriptor_ + 0x2c); lVar2 = lVar2 + 1) {
    FieldName_abi_cxx11_(&local_50,(cpp *)(*(long *)(this->descriptor_ + 0x30) + lVar1),field);
    io::Printer::Print(printer,
                       "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n",
                       "classname",&this->classname_,"name",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    lVar1 = lVar1 + 0x78;
    field = extraout_RDX_00;
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"};\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateOffsets(io::Printer* printer) {
  printer->Print(
    "static const int $classname$_offsets_[$field_count$] = {\n",
    "classname", classname_,
    "field_count", SimpleItoa(max(1, descriptor_->field_count())));
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    printer->Print(
      "GOOGLE_PROTOBUF_GENERATED_MESSAGE_FIELD_OFFSET($classname$, $name$_),\n",
      "classname", classname_,
      "name", FieldName(field));
  }

  printer->Outdent();
  printer->Print("};\n");
}